

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__depth_target____fx_depthtarget_common
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *buffer;
  bool bVar1;
  ulong in_RAX;
  uint64 *puVar2;
  StringHash SVar3;
  uint64 uVar4;
  undefined4 uVar5;
  uint *puVar6;
  ulong uVar7;
  xmlChar **ppxVar8;
  bool bVar9;
  bool failed;
  bool failed_3;
  bool failed_2;
  bool failed_1;
  undefined8 uStack_38;
  
  puVar2 = (uint64 *)
           GeneratedSaxParser::StackMemoryManager::newObject
                     (&(this->
                       super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                       ).super_ParserTemplateBase.mStackMemoryManager,0x20);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  *attributeDataPtr = puVar2;
  ppxVar8 = attributes->attributes;
  bVar9 = true;
  if (ppxVar8 != (xmlChar **)0x0) {
    uStack_38 = in_RAX;
    do {
      text = *ppxVar8;
      if (text == (ParserChar *)0x0) {
        validationDataPtr = (void **)0x3;
      }
      else {
        SVar3 = GeneratedSaxParser::Utils::calculateStringHash(text);
        buffer = ppxVar8[1];
        ppxVar8 = ppxVar8 + 2;
        if (0x704ac7 < (long)SVar3) {
          if (SVar3 == 0x7a2f95) {
            uVar4 = GeneratedSaxParser::Utils::toUint64(buffer,(bool *)((long)&uStack_38 + 5));
            puVar2[3] = uVar4;
            if (uStack_38._5_1_ == '\x01') {
              SVar3 = 0x7a2f95;
              goto LAB_006bd884;
            }
          }
          else {
            if (SVar3 != 0x704ac8) goto LAB_006bd813;
            uVar4 = GeneratedSaxParser::Utils::toUint64(buffer,(bool *)((long)&uStack_38 + 7));
            *puVar2 = uVar4;
            if (uStack_38._7_1_ == '\x01') {
              SVar3 = 0x704ac8;
              goto LAB_006bd884;
            }
          }
          goto LAB_006bd8a1;
        }
        if (SVar3 == 0x7400) {
          uVar4 = GeneratedSaxParser::Utils::toUint64(buffer,(bool *)((long)&uStack_38 + 6));
          puVar2[2] = uVar4;
          if (uStack_38._6_1_ == '\x01') {
            SVar3 = 0x7400;
LAB_006bd884:
            bVar9 = false;
            bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0x4f724,SVar3,buffer);
            if (!bVar1) goto LAB_006bd8a1;
            validationDataPtr = (void **)0x1;
          }
          else {
LAB_006bd8a1:
            validationDataPtr = (void **)0x4;
            bVar9 = true;
          }
          if (!bVar9) goto LAB_006bd8b0;
        }
        else {
          if (SVar3 == 0x6c795) {
            SVar3 = GeneratedSaxParser::Utils::calculateStringHash
                              (buffer,(bool *)((long)&uStack_38 + 4));
            bVar9 = false;
            uVar7 = 0;
            puVar6 = &DAT_0085e2d8;
            do {
              if (*(StringHash *)(puVar6 + -2) == SVar3) {
                uStack_38 = uStack_38 & 0xffffff0000000000;
                validationDataPtr = (void **)(ulong)*puVar6;
              }
              uVar5 = SUB84(validationDataPtr,0);
              if (*(StringHash *)(puVar6 + -2) == SVar3) break;
              bVar9 = 4 < uVar7;
              uVar7 = uVar7 + 1;
              puVar6 = puVar6 + 4;
            } while (uVar7 != 6);
            if (bVar9) {
              uStack_38 = CONCAT35(uStack_38._5_3_,0x100000000);
              uVar5 = 6;
            }
            *(undefined4 *)(puVar2 + 1) = uVar5;
            if (uStack_38._4_1_ == '\x01') {
              SVar3 = 0x6c795;
              goto LAB_006bd884;
            }
            goto LAB_006bd8a1;
          }
LAB_006bd813:
          bVar9 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0x4f724,text,buffer);
          validationDataPtr = (void **)0x1;
          if (bVar9) goto LAB_006bd8b0;
        }
        validationDataPtr = (void **)0x0;
      }
LAB_006bd8b0:
    } while ((int)validationDataPtr == 0);
    if ((int)validationDataPtr == 3) {
      bVar9 = true;
    }
    else {
      bVar9 = false;
    }
  }
  return bVar9;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__depth_target____fx_depthtarget_common( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__depth_target____fx_depthtarget_common( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

depth_target____fx_depthtarget_common__AttributeData* attributeData = newData<depth_target____fx_depthtarget_common__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_index:
    {
bool failed;
attributeData->index = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DEPTH_TARGET,
        HASH_ATTRIBUTE_index,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_face:
    {
bool failed;
attributeData->face = Utils::toEnum<ENUM__fx_surface_face_enum, StringHash, ENUM__fx_surface_face_enum__COUNT>(attributeValue, failed, ENUM__fx_surface_face_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DEPTH_TARGET,
        HASH_ATTRIBUTE_face,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_mip:
    {
bool failed;
attributeData->mip = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DEPTH_TARGET,
        HASH_ATTRIBUTE_mip,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_slice:
    {
bool failed;
attributeData->slice = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DEPTH_TARGET,
        HASH_ATTRIBUTE_slice,
        attributeValue))
{
    return false;
}

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_DEPTH_TARGET, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}